

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O2

void * TPZParFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
       ::GlobalAssemble(void *t)

{
  long lVar1;
  long lVar2;
  TPZCompEl *el;
  TPZGuiInterface *this;
  bool bVar3;
  int iVar4;
  TPZCompEl **ppTVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  TPZElementMatrix *pTVar9;
  TPZElementMatrix *pTVar10;
  TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
  *pTVar11;
  char *pcVar12;
  long lVar13;
  ostream *poVar14;
  long lVar15;
  TPZElementMatrix *local_78;
  TPZElementMatrix *local_70;
  unique_lock<std::mutex> global_lock;
  
  lVar1 = *(long *)((long)t + 8);
LAB_011d403a:
  do {
    do {
      lVar2 = *(long *)((long)t + 0xe8);
      if (lVar2 <= *(long *)((long)t + 0xe0)) {
LAB_011d4449:
        std::operator<<((ostream *)&std::cout,"Matrix assembled\n");
        std::ostream::flush();
        return (void *)0x0;
      }
      iVar4 = (int)(lVar2 / 200);
      if (lVar2 + 199U < 399) {
        iVar4 = 1;
      }
      if (*(long *)((long)t + 0xe0) % (long)iVar4 == 0) {
        std::operator<<((ostream *)&std::cout,"*");
      }
      std::ostream::flush();
      if ((*(long *)((long)t + 0xe0) != 0) &&
         (*(long *)((long)t + 0xe0) % (long)(iVar4 * 0x14) == 0)) {
        if (*(long *)((long)t + 0xd8) == *(long *)((long)t + 0xe8)) {
          poVar14 = (ostream *)&std::cout;
          pcVar12 = " ";
        }
        else {
          poVar14 = std::operator<<((ostream *)&std::cout," Element ");
          poVar14 = std::ostream::_M_insert<long>((long)poVar14);
          poVar14 = std::operator<<(poVar14," ");
          poVar14 = std::ostream::_M_insert<long>((long)poVar14);
          pcVar12 = "% Elements computed ";
        }
        poVar14 = std::operator<<(poVar14,pcVar12);
        poVar14 = std::ostream::_M_insert<long>((long)poVar14);
        poVar14 = std::operator<<(poVar14,"% Elements assembled ");
        std::endl<char,std::char_traits<char>>(poVar14);
        std::ostream::flush();
      }
      lVar2 = *(long *)((long)t + 0xe0);
      *(long *)((long)t + 0xe0) = lVar2 + 1;
      lVar13 = (long)*(int *)(*(long *)((long)t + 0xb0) + lVar2 * 4);
    } while (lVar13 < 0);
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)(lVar1 + 0x40),lVar13);
    el = *ppTVar5;
  } while (el == (TPZCompEl *)0x0);
  plVar6 = (long *)(**(code **)(*(long *)el + 0xb8))(el);
  if (plVar6 == (long *)0x0) {
    lVar13 = __dynamic_cast(el,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
    lVar15 = __dynamic_cast(el,&TPZCompEl::typeinfo,&TPZElementGroup::typeinfo,0);
    lVar7 = __dynamic_cast(el,&TPZCompEl::typeinfo,&TPZCondensedCompEl::typeinfo,0);
    if (((lVar13 == 0) && (lVar15 == 0)) && (lVar7 == 0)) goto LAB_011d403a;
  }
  else {
    iVar4 = (**(code **)(*plVar6 + 0x58))(plVar6);
    bVar3 = ::TPZStructMatrix::ShouldCompute((TPZStructMatrix *)t,iVar4);
    if (!bVar3) goto LAB_011d403a;
  }
  std::unique_lock<std::mutex>::unique_lock(&global_lock,&mutex_global_assemble);
  local_78 = (TPZElementMatrix *)0x0;
  local_70 = (TPZElementMatrix *)0x0;
  lVar13 = -1;
  do {
    lVar15 = 0;
LAB_011d427b:
    do {
      if (lVar13 == lVar2) {
        std::unique_lock<std::mutex>::~unique_lock(&global_lock);
        TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
        ::AssembleElement((TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                           *)t,el,local_70,local_78,
                          *(TPZMatrix<std::complex<double>_> **)((long)t + 0xf8),
                          *(TPZFMatrix<std::complex<double>_> **)((long)t + 0x100));
        if (*(long *)((long)t + 0xe0) == *(long *)((long)t + 0xe8)) {
          pTVar11 = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                     *)__dynamic_cast(*(undefined8 *)((long)t + 0xf8),
                                      &TPZMatrix<std::complex<double>>::typeinfo,
                                      &TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontNonSym<std::complex<double>>>
                                       ::typeinfo,0);
          TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
          ::FinishWriting(pTVar11);
        }
        (*local_70->_vptr_TPZElementMatrix[1])(local_70);
        (*local_78->_vptr_TPZElementMatrix[1])(local_78);
        if (((*(undefined8 **)((long)t + 0xd0) == (undefined8 *)0x0) ||
            (this = (TPZGuiInterface *)**(undefined8 **)((long)t + 0xd0),
            this == (TPZGuiInterface *)0x0)) || (bVar3 = TPZGuiInterface::AmIKilled(this), !bVar3))
        goto LAB_011d403a;
        pTVar11 = (TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                   *)__dynamic_cast(*(undefined8 *)((long)t + 0xf8),
                                    &TPZMatrix<std::complex<double>>::typeinfo,
                                    &TPZParFrontMatrix<std::complex<double>,TPZFileEqnStorage<std::complex<double>>,TPZFrontNonSym<std::complex<double>>>
                                     ::typeinfo,0);
        TPZParFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
        ::FinishWriting(pTVar11);
        goto LAB_011d4449;
      }
      lVar7 = *(long *)((long)t + 0x118);
      lVar8 = lVar7;
      if (lVar7 < lVar15) {
        lVar8 = lVar15;
      }
      for (; lVar15 < lVar7; lVar15 = lVar15 + 1) {
        if (*(long *)(*(long *)((long)t + 0x110) + lVar15 * 8) == lVar2) {
          local_70 = *(TPZElementMatrix **)(*(long *)((long)t + 0x180) + lVar15 * 8);
          local_78 = *(TPZElementMatrix **)(*(long *)((long)t + 0x1f0) + lVar15 * 8);
          lVar8 = TPZStack<long,_10>::Pop((TPZStack<long,_10> *)((long)t + 0x108));
          pTVar9 = TPZStack<TPZElementMatrix_*,_10>::Pop
                             ((TPZStack<TPZElementMatrix_*,_10> *)((long)t + 0x178));
          pTVar10 = TPZStack<TPZElementMatrix_*,_10>::Pop
                              ((TPZStack<TPZElementMatrix_*,_10> *)((long)t + 0x1e8));
          lVar7 = *(long *)((long)t + 0x118);
          if (lVar7 < *(int *)((long)t + 0xf0)) {
            std::condition_variable::notify_all();
            lVar7 = *(long *)((long)t + 0x118);
          }
          lVar13 = lVar2;
          if (lVar15 < lVar7) {
            *(long *)(*(long *)((long)t + 0x110) + lVar15 * 8) = lVar8;
            *(TPZElementMatrix **)(*(long *)((long)t + 0x180) + lVar15 * 8) = pTVar9;
            *(TPZElementMatrix **)(*(long *)((long)t + 0x1f0) + lVar15 * 8) = pTVar10;
          }
          goto LAB_011d427b;
        }
      }
      lVar15 = lVar8;
    } while (lVar13 == lVar2);
    std::condition_variable::wait((unique_lock *)condassemble);
  } while( true );
}

Assistant:

void *TPZParFrontStructMatrix<TFront,TVar,TPar>::GlobalAssemble(void *t){
    
	TPZParFrontStructMatrix<TFront,TVar,TPar> *parfront = (TPZParFrontStructMatrix<TFront,TVar,TPar> *) t;
	TPZAdmChunkVector<TPZCompEl *> &elementvec = parfront->fMesh->ElementVec();
	while(parfront->fCurrentAssembled < parfront->fNElements) {
		
#ifndef USING_ATLAS
        const int unit = (parfront->fNElements/200 == 0 ? 1 : parfront->fNElements/200);
        if(!(parfront->fCurrentAssembled%unit))std::cout << "*";
		std::cout.flush();
		if(!(parfront->fCurrentAssembled%(20*unit)) && parfront->fCurrentAssembled)
        {
			if(parfront->fCurrentElement!=parfront->fNElements){
				std::cout << " Element " << parfront->fCurrentElement << " " << (100*parfront->fCurrentElement/parfront->fNElements) << "% Elements computed " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled " << std::endl;
				std::cout.flush();
			}else{
				std::cout << " " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled " << std::endl;
				std::cout.flush();
			}
		}
#endif
		/**
		 *Lock mutex and search for an available element
		 *A global variable to be updated whenever a element is processed
		 */
		
		//Lock a mutex and get an element number
		int64_t local_element = parfront->fCurrentAssembled;
		parfront->fCurrentAssembled++;
		
		if(parfront->fElementOrder[local_element] < 0) continue;
		TPZCompEl *el = elementvec[parfront->fElementOrder[local_element]];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(parfront->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else 
		{
			TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            TPZElementGroup *elgrp = dynamic_cast<TPZElementGroup *>(el);
            TPZCondensedCompEl *condel = dynamic_cast<TPZCondensedCompEl *>(el);
			if(!submesh && ! elgrp && ! condel)
			{
				continue;
			}
		}
		
		//Searches for next element
		int64_t i=0;
		int64_t aux = -1;
		TPZElementMatrix *ekaux = 0, *efaux = 0;
        {
            std::unique_lock<std::mutex> global_lock(mutex_global_assemble);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Acquired mutex_global_assemble";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            while(aux != local_element){
                while(i < parfront->felnum.NElements()) {
                    if(parfront->felnum[i] == local_element){
                        TPZElementMatrix *ektemp, *eftemp;
                        aux = parfront->felnum[i];
                        ekaux = parfront->fekstack[i];
                        efaux = parfront->fefstack[i];
                        int64_t itemp = parfront->felnum.Pop();
                        ektemp = parfront->fekstack.Pop();
                        eftemp = parfront->fefstack.Pop();
                        if(parfront->felnum.NElements()<parfront->fMaxStackSize){
                            stackfull.notify_all();
                        }
                        if(i < parfront->felnum.NElements()) {
                            
                            parfront->felnum[i] = itemp;
                            parfront->fekstack[i]=ektemp;
                            parfront->fefstack[i]=eftemp;
                        }
                        break;
                    }
                    i++;
                }
                if(aux!=local_element){
                    i=0;
    #ifdef PZ_LOG
                    if (logger.isDebugEnabled())
                    {
                        std::stringstream sout;
                        sout << "Waiting on condassemble";
                        LOGPZ_DEBUG(logger,sout.str())
                    }
    #endif
                    condassemble.wait(global_lock);
                }
            }
    #ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Unlocking mutex_global_assemble";
                LOGPZ_DEBUG(logger,sout.str())
            }
    #endif
            // global_lock is being destroyed...
        }
		parfront->AssembleElement(el, *ekaux, *efaux, *parfront->fStiffness, *parfront->fRhs);
		if(parfront->fCurrentAssembled == parfront->fNElements)
		{
#ifdef STACKSTORAGE
            TPZParFrontMatrix<TVar,TPZStackEqnStorage<TVar>, TFront> *mat = dynamic_cast< TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front>* > (parfront->fStiffness);
#else
            TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (parfront->fStiffness);
            
#endif
			mat->FinishWriting();
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "fFinishedComputing set to 1";
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
		}
		
		delete ekaux;
		delete efaux;
		
		if(parfront->fGuiInterface) if(parfront->fGuiInterface->AmIKilled()){
#ifdef STACKSTORAGE
			TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZStackEqnStorage<TVar>, front>* > (parfront->fStiffness);
#else
            TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront> *mat = dynamic_cast<TPZParFrontMatrix<TVar, TPZFileEqnStorage<TVar>, TFront>* > (parfront->fStiffness);
            
#endif
			mat->FinishWriting();
			break;
		}
		
		
	}//fim for iel
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Terminating assemble thread";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << "Matrix assembled\n";
	std::cout.flush();

	return 0;
}